

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

void __thiscall
KDIS::KDataStream::KDataStream
          (KDataStream *this,KOCTET *SerialData,KUINT16 DataSize,Endian Network_Endian)

{
  KBOOL KVar1;
  value_type_conflict local_23;
  ushort local_22;
  Endian local_20;
  KUINT16 i;
  Endian Network_Endian_local;
  KUINT16 DataSize_local;
  KOCTET *SerialData_local;
  KDataStream *this_local;
  
  this->m_NetEndian = Network_Endian;
  local_20 = Network_Endian;
  i = DataSize;
  _Network_Endian_local = SerialData;
  SerialData_local = (KOCTET *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vBuffer);
  this->m_ui16CurrentWritePos = 0;
  for (local_22 = 0; local_22 < i; local_22 = local_22 + 1) {
    local_23 = _Network_Endian_local[local_22];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vBuffer,&local_23);
  }
  KVar1 = UTILS::IsMachineBigEndian();
  if (KVar1) {
    this->m_MachineEndian = Big_Endian;
  }
  else {
    this->m_MachineEndian = Little_Endian;
  }
  return;
}

Assistant:

KDataStream::KDataStream( KOCTET * SerialData, KUINT16 DataSize, Endian Network_Endian /*= Big_Endian */ ) :
    m_NetEndian( Network_Endian ),
    m_ui16CurrentWritePos( 0 )
{
    // Copy Data into vector
    for( KUINT16 i = 0; i < DataSize; ++i )
    {
        m_vBuffer.push_back( SerialData[i] );
    }

    if( IsMachineBigEndian() == true )
    {
        m_MachineEndian = Big_Endian;
    }
    else
    {
        m_MachineEndian = Little_Endian;
    }
}